

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_gcdext(__mpz_struct *g,__mpz_struct *s,__mpz_struct *t,__mpz_struct *u,__mpz_struct *v)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  mp_limb_t *pmVar4;
  undefined8 uVar5;
  ulong *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  undefined8 uVar10;
  __mpz_struct *p_Var11;
  __mpz_struct *p_Var12;
  __mpz_struct *p_Var13;
  int iVar14;
  mp_bitcnt_t mVar15;
  mp_bitcnt_t mVar16;
  int iVar17;
  mp_bitcnt_t bits;
  __mpz_struct *p_Var18;
  ulong uVar19;
  uint uVar20;
  mp_bitcnt_t bit_index;
  long lVar21;
  bool bVar22;
  mpz_t s1;
  mpz_t t1;
  mpz_t tu;
  __mpz_struct local_c8;
  __mpz_struct local_b8;
  __mpz_struct local_a8;
  __mpz_struct local_98;
  __mpz_struct local_88;
  __mpz_struct local_78;
  __mpz_struct *local_60;
  __mpz_struct *local_58;
  __mpz_struct *local_50;
  __mpz_struct *local_48;
  __mpz_struct *local_40;
  mp_bitcnt_t local_38;
  
  iVar14 = u->_mp_size;
  iVar1 = v->_mp_size;
  if (iVar14 == 0) {
    mpz_set(g,v);
    iVar14 = g->_mp_size;
    iVar17 = -iVar14;
    if (0 < iVar14) {
      iVar17 = iVar14;
    }
    g->_mp_size = iVar17;
    if (s != (__mpz_struct *)0x0) {
      s->_mp_size = 0;
    }
    if (t != (__mpz_struct *)0x0) {
      mpz_set_si(t,(long)(int)((uint)(iVar1 != 0) | iVar1 >> 0x1f));
      return;
    }
  }
  else if (iVar1 == 0) {
    mpz_set(g,u);
    iVar1 = g->_mp_size;
    iVar17 = -iVar1;
    if (0 < iVar1) {
      iVar17 = iVar1;
    }
    g->_mp_size = iVar17;
    if (s != (__mpz_struct *)0x0) {
      mpz_set_si(s,(long)(int)(iVar14 >> 0x1f | 1));
    }
    if (t != (__mpz_struct *)0x0) {
      t->_mp_size = 0;
    }
  }
  else {
    local_78._mp_alloc = 0;
    local_78._mp_size = 0;
    local_78._mp_d = &mpz_init::dummy_limb;
    local_a8._mp_alloc = 0;
    local_a8._mp_size = 0;
    local_a8._mp_d = &mpz_init::dummy_limb;
    local_c8._mp_alloc = 0;
    local_c8._mp_size = 0;
    local_c8._mp_d = &mpz_init::dummy_limb;
    local_98._mp_alloc = 0;
    local_98._mp_size = 0;
    local_98._mp_d = &mpz_init::dummy_limb;
    local_b8._mp_alloc = 0;
    local_b8._mp_size = 0;
    local_b8._mp_d = &mpz_init::dummy_limb;
    local_88._mp_alloc = 0;
    local_88._mp_size = 0;
    local_88._mp_d = &mpz_init::dummy_limb;
    local_60 = t;
    local_40 = g;
    mpz_set(&local_78,u);
    iVar14 = -local_78._mp_size;
    if (0 < local_78._mp_size) {
      iVar14 = local_78._mp_size;
    }
    local_78._mp_size = iVar14;
    mVar15 = mpz_make_odd(&local_78);
    local_58 = v;
    mpz_set(&local_a8,v);
    iVar14 = -local_a8._mp_size;
    if (0 < local_a8._mp_size) {
      iVar14 = local_a8._mp_size;
    }
    local_a8._mp_size = iVar14;
    mVar16 = mpz_make_odd(&local_a8);
    pmVar4 = local_78._mp_d;
    iVar14 = local_78._mp_size;
    local_38 = mVar16;
    if (mVar15 < mVar16) {
      local_38 = mVar15;
    }
    mVar15 = mVar15 - local_38;
    mVar16 = mVar16 - local_38;
    if (local_78._mp_size < local_a8._mp_size) {
      iVar1 = local_a8._mp_alloc;
      local_78._mp_d = local_a8._mp_d;
      local_a8._mp_d = pmVar4;
      local_78._mp_size = local_a8._mp_size;
      local_a8._mp_size = iVar14;
      local_a8._mp_alloc = local_78._mp_alloc;
      bits = mVar16;
      bit_index = mVar15;
      local_50 = s;
      local_48 = u;
      local_78._mp_alloc = iVar1;
    }
    else {
      local_48 = local_58;
      local_50 = local_60;
      bits = mVar15;
      bit_index = mVar16;
      local_60 = s;
      local_58 = u;
    }
    mpz_div_qr(&local_88,&local_78,&local_78,&local_a8,GMP_DIV_TRUNC);
    mpz_mul_2exp(&local_88,&local_88,bits);
    mpz_setbit(&local_98,bit_index);
    lVar21 = mVar16 + mVar15;
    if (local_78._mp_size < 1) {
      mpz_setbit(&local_b8,bits);
    }
    else {
      mVar15 = mpz_make_odd(&local_78);
      mpz_setbit(&local_b8,bits + mVar15);
      lVar21 = lVar21 + mVar15;
      do {
        iVar14 = mpz_cmp(&local_78,&local_a8);
        if (iVar14 != 0) {
          if (iVar14 < 0) {
            mpz_sub(&local_a8,&local_a8,&local_78);
            mpz_add(&local_b8,&local_b8,&local_88);
            mpz_add(&local_c8,&local_c8,&local_98);
            mVar15 = mpz_make_odd(&local_a8);
            mpz_mul_2exp(&local_88,&local_88,mVar15);
            p_Var18 = &local_98;
          }
          else {
            mpz_sub(&local_78,&local_78,&local_a8);
            mpz_add(&local_88,&local_b8,&local_88);
            mpz_add(&local_98,&local_c8,&local_98);
            mVar15 = mpz_make_odd(&local_78);
            mpz_mul_2exp(&local_b8,&local_b8,mVar15);
            p_Var18 = &local_c8;
          }
          mpz_mul_2exp(p_Var18,p_Var18,mVar15);
          lVar21 = lVar21 + mVar15;
        }
      } while (iVar14 != 0);
    }
    mpz_mul_2exp(&local_a8,&local_a8,local_38);
    p_Var18 = local_48;
    local_c8._mp_size = -local_c8._mp_size;
    mpz_div_qr(&local_98,(__mpz_struct *)0x0,local_48,&local_a8,GMP_DIV_TRUNC);
    iVar14 = -local_98._mp_size;
    if (0 < local_98._mp_size) {
      iVar14 = local_98._mp_size;
    }
    local_98._mp_size = iVar14;
    mpz_div_qr(&local_88,(__mpz_struct *)0x0,local_58,&local_a8,GMP_DIV_TRUNC);
    iVar14 = -local_88._mp_size;
    if (0 < local_88._mp_size) {
      iVar14 = local_88._mp_size;
    }
    local_88._mp_size = iVar14;
    if (lVar21 != 0) {
      do {
        if (((local_c8._mp_size != 0) && ((*local_c8._mp_d & 1) != 0)) ||
           ((local_b8._mp_size != 0 && ((*local_b8._mp_d & 1) != 0)))) {
          mpz_sub(&local_c8,&local_c8,&local_98);
          mpz_add(&local_b8,&local_b8,&local_88);
        }
        lVar21 = lVar21 + -1;
        mpz_div_q_2exp(&local_c8,&local_c8,1,GMP_DIV_TRUNC);
        mpz_div_q_2exp(&local_b8,&local_b8,1,GMP_DIV_TRUNC);
      } while (lVar21 != 0);
    }
    mpz_add(&local_98,&local_c8,&local_98);
    p_Var13 = local_40;
    p_Var12 = local_50;
    p_Var11 = local_60;
    pmVar4 = local_c8._mp_d;
    uVar9 = -local_c8._mp_size;
    if (0 < local_c8._mp_size) {
      uVar9 = local_c8._mp_size;
    }
    uVar20 = -local_98._mp_size;
    if (0 < local_98._mp_size) {
      uVar20 = local_98._mp_size;
    }
    bVar22 = uVar20 <= uVar9;
    if (uVar9 == uVar20) {
      uVar19 = (ulong)uVar9;
      do {
        if ((long)uVar19 < 1) goto LAB_005eb415;
        uVar2 = local_98._mp_d[uVar19 - 1];
        uVar3 = local_c8._mp_d[uVar19 - 1];
        uVar19 = uVar19 - 1;
      } while (uVar3 == uVar2);
      bVar22 = uVar2 <= uVar3 && uVar3 != uVar2;
    }
    if (bVar22) {
      local_c8._mp_d = local_98._mp_d;
      local_98._mp_d = pmVar4;
      uVar10._0_4_ = local_98._mp_alloc;
      uVar10._4_4_ = local_98._mp_size;
      local_98._mp_alloc = local_c8._mp_alloc;
      local_98._mp_size = local_c8._mp_size;
      local_c8._0_8_ = uVar10;
      mpz_sub(&local_b8,&local_b8,&local_88);
    }
LAB_005eb415:
    if (local_58->_mp_size < 0) {
      local_c8._mp_size = -local_c8._mp_size;
    }
    if (p_Var18->_mp_size < 0) {
      local_b8._mp_size = -local_b8._mp_size;
    }
    pmVar4 = p_Var13->_mp_d;
    p_Var13->_mp_d = local_a8._mp_d;
    uVar5._0_4_ = p_Var13->_mp_alloc;
    uVar5._4_4_ = p_Var13->_mp_size;
    p_Var13->_mp_alloc = local_a8._mp_alloc;
    p_Var13->_mp_size = local_a8._mp_size;
    if (p_Var11 != (__mpz_struct *)0x0) {
      puVar6 = p_Var11->_mp_d;
      p_Var11->_mp_d = local_c8._mp_d;
      uVar7._0_4_ = p_Var11->_mp_alloc;
      uVar7._4_4_ = p_Var11->_mp_size;
      p_Var11->_mp_alloc = local_c8._mp_alloc;
      p_Var11->_mp_size = local_c8._mp_size;
      local_c8._0_8_ = uVar7;
      local_c8._mp_d = puVar6;
    }
    if (p_Var12 != (__mpz_struct *)0x0) {
      puVar6 = p_Var12->_mp_d;
      p_Var12->_mp_d = local_b8._mp_d;
      uVar8._0_4_ = p_Var12->_mp_alloc;
      uVar8._4_4_ = p_Var12->_mp_size;
      p_Var12->_mp_alloc = local_b8._mp_alloc;
      p_Var12->_mp_size = local_b8._mp_size;
      local_b8._0_8_ = uVar8;
      local_b8._mp_d = puVar6;
    }
    local_a8._0_8_ = uVar5;
    local_a8._mp_d = pmVar4;
    if ((long)local_78._mp_alloc != 0) {
      (*gmp_free_func)(local_78._mp_d,(long)local_78._mp_alloc << 3);
    }
    if ((long)local_a8._mp_alloc != 0) {
      (*gmp_free_func)(local_a8._mp_d,(long)local_a8._mp_alloc << 3);
    }
    if ((long)local_c8._mp_alloc != 0) {
      (*gmp_free_func)(local_c8._mp_d,(long)local_c8._mp_alloc << 3);
    }
    if ((long)local_98._mp_alloc != 0) {
      (*gmp_free_func)(local_98._mp_d,(long)local_98._mp_alloc << 3);
    }
    if ((long)local_b8._mp_alloc != 0) {
      (*gmp_free_func)(local_b8._mp_d,(long)local_b8._mp_alloc << 3);
    }
    if ((long)local_88._mp_alloc != 0) {
      (*gmp_free_func)(local_88._mp_d,(long)local_88._mp_alloc << 3);
    }
  }
  return;
}

Assistant:

void
mpz_gcdext (mpz_t g, mpz_t s, mpz_t t, const mpz_t u, const mpz_t v)
{
  mpz_t tu, tv, s0, s1, t0, t1;
  mp_bitcnt_t uz, vz, gz;
  mp_bitcnt_t power;

  if (u->_mp_size == 0)
    {
      /* g = 0 u + sgn(v) v */
      signed long sign = mpz_sgn (v);
      mpz_abs (g, v);
      if (s)
	s->_mp_size = 0;
      if (t)
	mpz_set_si (t, sign);
      return;
    }

  if (v->_mp_size == 0)
    {
      /* g = sgn(u) u + 0 v */
      signed long sign = mpz_sgn (u);
      mpz_abs (g, u);
      if (s)
	mpz_set_si (s, sign);
      if (t)
	t->_mp_size = 0;
      return;
    }

  mpz_init (tu);
  mpz_init (tv);
  mpz_init (s0);
  mpz_init (s1);
  mpz_init (t0);
  mpz_init (t1);

  mpz_abs (tu, u);
  uz = mpz_make_odd (tu);
  mpz_abs (tv, v);
  vz = mpz_make_odd (tv);
  gz = GMP_MIN (uz, vz);

  uz -= gz;
  vz -= gz;

  /* Cofactors corresponding to odd gcd. gz handled later. */
  if (tu->_mp_size < tv->_mp_size)
    {
      mpz_swap (tu, tv);
      MPZ_SRCPTR_SWAP (u, v);
      MPZ_PTR_SWAP (s, t);
      MP_BITCNT_T_SWAP (uz, vz);
    }

  /* Maintain
   *
   * u = t0 tu + t1 tv
   * v = s0 tu + s1 tv
   *
   * where u and v denote the inputs with common factors of two
   * eliminated, and det (s0, t0; s1, t1) = 2^p. Then
   *
   * 2^p tu =  s1 u - t1 v
   * 2^p tv = -s0 u + t0 v
   */

  /* After initial division, tu = q tv + tu', we have
   *
   * u = 2^uz (tu' + q tv)
   * v = 2^vz tv
   *
   * or
   *
   * t0 = 2^uz, t1 = 2^uz q
   * s0 = 0,    s1 = 2^vz
   */

  mpz_tdiv_qr (t1, tu, tu, tv);
  mpz_mul_2exp (t1, t1, uz);

  mpz_setbit (s1, vz);
  power = uz + vz;

  if (tu->_mp_size > 0)
    {
      mp_bitcnt_t shift;
      shift = mpz_make_odd (tu);
      mpz_setbit (t0, uz + shift);
      power += shift;

      for (;;)
	{
	  int c;
	  c = mpz_cmp (tu, tv);
	  if (c == 0)
	    break;

	  if (c < 0)
	    {
	      /* tv = tv' + tu
	       *
	       * u = t0 tu + t1 (tv' + tu) = (t0 + t1) tu + t1 tv'
	       * v = s0 tu + s1 (tv' + tu) = (s0 + s1) tu + s1 tv' */

	      mpz_sub (tv, tv, tu);
	      mpz_add (t0, t0, t1);
	      mpz_add (s0, s0, s1);

	      shift = mpz_make_odd (tv);
	      mpz_mul_2exp (t1, t1, shift);
	      mpz_mul_2exp (s1, s1, shift);
	    }
	  else
	    {
	      mpz_sub (tu, tu, tv);
	      mpz_add (t1, t0, t1);
	      mpz_add (s1, s0, s1);

	      shift = mpz_make_odd (tu);
	      mpz_mul_2exp (t0, t0, shift);
	      mpz_mul_2exp (s0, s0, shift);
	    }
	  power += shift;
	}
    }
  else
    mpz_setbit (t0, uz);

  /* Now tv = odd part of gcd, and -s0 and t0 are corresponding
     cofactors. */

  mpz_mul_2exp (tv, tv, gz);
  mpz_neg (s0, s0);

  /* 2^p g = s0 u + t0 v. Eliminate one factor of two at a time. To
     adjust cofactors, we need u / g and v / g */

  mpz_divexact (s1, v, tv);
  mpz_abs (s1, s1);
  mpz_divexact (t1, u, tv);
  mpz_abs (t1, t1);

  while (power-- > 0)
    {
      /* s0 u + t0 v = (s0 - v/g) u - (t0 + u/g) v */
      if (mpz_odd_p (s0) || mpz_odd_p (t0))
	{
	  mpz_sub (s0, s0, s1);
	  mpz_add (t0, t0, t1);
	}
      assert (mpz_even_p (t0) && mpz_even_p (s0));
      mpz_tdiv_q_2exp (s0, s0, 1);
      mpz_tdiv_q_2exp (t0, t0, 1);
    }

  /* Arrange so that |s| < |u| / 2g */
  mpz_add (s1, s0, s1);
  if (mpz_cmpabs (s0, s1) > 0)
    {
      mpz_swap (s0, s1);
      mpz_sub (t0, t0, t1);
    }
  if (u->_mp_size < 0)
    mpz_neg (s0, s0);
  if (v->_mp_size < 0)
    mpz_neg (t0, t0);

  mpz_swap (g, tv);
  if (s)
    mpz_swap (s, s0);
  if (t)
    mpz_swap (t, t0);

  mpz_clear (tu);
  mpz_clear (tv);
  mpz_clear (s0);
  mpz_clear (s1);
  mpz_clear (t0);
  mpz_clear (t1);
}